

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

void hmac_free(ssh2_mac *mac)

{
  ssh2_mac *b;
  hmac *ctx;
  ssh2_mac *mac_local;
  
  b = mac + -3;
  ssh_hash_free((ssh_hash *)mac[-3].binarysink_);
  ssh_hash_free((ssh_hash *)mac[-2].vt);
  ssh_hash_free((ssh_hash *)mac[-2].binarysink_);
  smemclr(mac[-1].vt,(size_t)b->vt->text_name);
  safefree(mac[-1].vt);
  strbuf_free((strbuf *)mac[-1].binarysink_);
  smemclr(b,0x40);
  safefree(b);
  return;
}

Assistant:

static void hmac_free(ssh2_mac *mac)
{
    struct hmac *ctx = container_of(mac, struct hmac, mac);

    ssh_hash_free(ctx->h_outer);
    ssh_hash_free(ctx->h_inner);
    ssh_hash_free(ctx->h_live);
    smemclr(ctx->digest, ctx->hashalg->hlen);
    sfree(ctx->digest);
    strbuf_free(ctx->text_name);

    smemclr(ctx, sizeof(*ctx));
    sfree(ctx);
}